

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O2

void __thiscall
icu_63::DateFormatSymbols::setMonths
          (DateFormatSymbols *this,UnicodeString *monthsArray,int32_t count)

{
  UnicodeString *pUVar1;
  UnicodeString *p;
  long lVar2;
  
  pUVar1 = this->fMonths;
  if (pUVar1 != (UnicodeString *)0x0) {
    lVar2 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    p = monthsArray;
    if (lVar2 != 0) {
      lVar2 = lVar2 << 6;
      do {
        icu_63::UnicodeString::~UnicodeString
                  ((UnicodeString *)
                   ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar2));
        lVar2 = lVar2 + -0x40;
      } while (lVar2 != 0);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),p);
  }
  pUVar1 = newUnicodeStringArray((long)count);
  this->fMonths = pUVar1;
  uprv_arrayCopy(monthsArray,pUVar1,count);
  this->fMonthsCount = count;
  return;
}

Assistant:

void
DateFormatSymbols::setMonths(const UnicodeString* monthsArray, int32_t count)
{
    // delete the old list if we own it
    if (fMonths)
        delete[] fMonths;

    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)
    fMonths = newUnicodeStringArray(count);
    uprv_arrayCopy( monthsArray,fMonths,count);
    fMonthsCount = count;
}